

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::OutputSingleGroupWithLimit
               (set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                *group,string *line_indentation,string *header,string *footer,
               bool long_output_format,int *remaining_line_limit,size_t *completion_elements_output,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *completions)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  size_type __n;
  reference ppCVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  _Self local_c0;
  _Self local_b8;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int *local_38;
  int *remaining_line_limit_local;
  string *psStack_28;
  bool long_output_format_local;
  string *footer_local;
  string *header_local;
  string *line_indentation_local;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *group_local;
  
  local_38 = remaining_line_limit;
  remaining_line_limit_local._7_1_ = long_output_format;
  psStack_28 = footer;
  footer_local = header;
  header_local = line_indentation;
  line_indentation_local = (string *)group;
  bVar2 = std::
          set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
          ::empty(group);
  if (!bVar2) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      if (*local_38 < 2) {
        return;
      }
      *local_38 = *local_38 + -2;
      std::operator+(&local_58,header_local,footer_local);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(completions,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      psVar1 = header_local;
      __n = std::__cxx11::string::size();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,__n,'-',(allocator<char> *)((long)&it._M_node + 7));
      std::operator+(&local_88,psVar1,&local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(completions,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
    }
    local_b8._M_node =
         (_Base_ptr)
         std::
         set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
         ::begin((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                  *)line_indentation_local);
    while( true ) {
      local_c0._M_node =
           (_Base_ptr)
           std::
           set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
           ::end((set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
                  *)line_indentation_local);
      bVar3 = std::operator!=(&local_b8,&local_c0);
      psVar1 = header_local;
      bVar2 = false;
      if (bVar3) {
        bVar2 = 0 < *local_38;
      }
      if (!bVar2) break;
      *local_38 = *local_38 + -1;
      *completion_elements_output = *completion_elements_output + 1;
      if ((remaining_line_limit_local._7_1_ & 1) == 0) {
        ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                            (&local_b8);
        GetShortFlagLine(&local_e0,psVar1,*ppCVar5);
      }
      else {
        ppCVar5 = std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator*
                            (&local_b8);
        GetLongFlagLine(&local_e0,psVar1,*ppCVar5);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(completions,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::_Rb_tree_const_iterator<const_gflags::CommandLineFlagInfo_*>::operator++(&local_b8);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (0 < *local_38)) {
      *local_38 = *local_38 + -1;
      std::operator+(&local_100,header_local,psStack_28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(completions,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
    }
  }
  return;
}

Assistant:

static void OutputSingleGroupWithLimit(
    const set<const CommandLineFlagInfo *> &group,
    const string &line_indentation,
    const string &header,
    const string &footer,
    bool long_output_format,
    int *remaining_line_limit,
    size_t *completion_elements_output,
    vector<string> *completions) {
  if (group.empty()) return;
  if (!header.empty()) {
    if (*remaining_line_limit < 2) return;
    *remaining_line_limit -= 2;
    completions->push_back(line_indentation + header);
    completions->push_back(line_indentation + string(header.size(), '-'));
  }
  for (set<const CommandLineFlagInfo *>::const_iterator it = group.begin();
      it != group.end() && *remaining_line_limit > 0;
      ++it) {
    --*remaining_line_limit;
    ++*completion_elements_output;
    completions->push_back(
        (long_output_format
          ? GetLongFlagLine(line_indentation, **it)
          : GetShortFlagLine(line_indentation, **it)));
  }
  if (!footer.empty()) {
    if (*remaining_line_limit < 1) return;
    --*remaining_line_limit;
    completions->push_back(line_indentation + footer);
  }
}